

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::addAttachments(QPDFJob *this,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer pbVar4;
  QPDFEFStreamObjectHelper *this_00;
  long *plVar5;
  runtime_error *this_01;
  size_type *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  iterator __end2;
  iterator __begin2;
  list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *plVar8;
  pointer pbVar9;
  bool bVar10;
  QPDFFileSpecObjectHelper fs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  duplicated_keys;
  QPDFEFStreamObjectHelper efs;
  QPDFEmbeddedFileDocumentHelper efdh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  QPDF *local_170;
  QPDFJob *local_168;
  QPDFFileSpecObjectHelper local_160;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  undefined1 local_a8 [24];
  element_type *local_90;
  QPDFEFStreamObjectHelper local_88;
  string local_50;
  
  p_Var1 = &local_160.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_168 = this;
  local_160.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"/UseAttachments","");
  maybe_set_pagemode(pdf,(string *)&local_160);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_160.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
    operator_delete(local_160.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    CONCAT71(local_160.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._1_7_,
                             local_160.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_1_) + 1);
  }
  local_170 = pdf;
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)&local_50,pdf);
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3 = (local_168->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar5 = *(long **)&(peVar3->attachments_to_add).
                      super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>
                      ._M_impl._M_node.super__List_node_base;
  plVar8 = &peVar3->attachments_to_add;
  if ((list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *)plVar5 != plVar8) {
    do {
      if ((char)plVar5[0x1e] == '\0') {
        QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
                  ((QPDFEmbeddedFileDocumentHelper *)(local_a8 + 0x10),&local_50);
        bVar10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._16_8_ !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (local_90 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90);
        }
      }
      else {
        bVar10 = false;
      }
      if (bVar10) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_108,(value_type *)(plVar5 + 6));
      }
      else {
        QPDFFileSpecObjectHelper::createFileSpec
                  (&local_160,local_170,(string *)(plVar5 + 10),(string *)(plVar5 + 2));
        if (plVar5[0x1b] != 0) {
          QPDFFileSpecObjectHelper::setDescription(&local_160,(string *)(plVar5 + 0x1a));
        }
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
        QPDFFileSpecObjectHelper::getEmbeddedFileStream
                  ((QPDFFileSpecObjectHelper *)local_a8,(string *)&local_160);
        QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper(&local_88,(QPDFObjectHandle *)local_a8);
        if ((element_type *)local_a8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        this_00 = QPDFEFStreamObjectHelper::setCreationDate(&local_88,(string *)(plVar5 + 0xe));
        QPDFEFStreamObjectHelper::setModDate(this_00,(string *)(plVar5 + 0x12));
        if (plVar5[0x17] != 0) {
          QPDFEFStreamObjectHelper::setSubtype(&local_88,(string *)(plVar5 + 0x16));
        }
        QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
                  ((QPDFEmbeddedFileDocumentHelper *)&local_50,(string *)(plVar5 + 6),&local_160);
        local_128._8_8_ = 0;
        pcStack_110 = std::
                      _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2111:21)>
                      ::_M_invoke;
        local_118 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2111:21)>
                    ::_M_manager;
        local_128._M_unused._M_object = (string *)(plVar5 + 2);
        doIfVerbose(local_168,
                    (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_128);
        if (local_118 != (code *)0x0) {
          (*local_118)(&local_128,&local_128,__destroy_functor);
        }
        QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper(&local_88);
        QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper(&local_160);
      }
      plVar5 = (long *)*plVar5;
    } while ((list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *)plVar5 !=
             plVar8);
  }
  pbVar4 = local_108.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_160.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
         (_func_int **)
         &local_160.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_160.super_QPDFObjectHelper.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_160.super_QPDFObjectHelper.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ = 0;
    pbVar9 = local_108.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_160.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::__cxx11::string::append((char *)&local_160);
      }
      std::__cxx11::string::_M_append((char *)&local_160,(ulong)(pbVar9->_M_dataplus)._M_p);
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar4);
    QPDF::getFilename_abi_cxx11_(&local_c8,local_170);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_e8._M_dataplus._M_p = (pointer)*plVar5;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_e8._M_dataplus._M_p == psVar6) {
      local_e8.field_2._M_allocated_capacity = *psVar6;
      local_e8.field_2._8_8_ = plVar5[3];
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar6;
    }
    local_e8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::operator+(&local_190,&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             &local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)*plVar5;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar5 + 2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper == p_Var7) {
      local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7->_vptr__Sp_counted_base;
      local_88.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)plVar5[3];
      local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var2;
    }
    else {
      local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7->_vptr__Sp_counted_base;
    }
    local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)plVar5[1];
    *plVar5 = (long)p_Var7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_160,(string *)&local_88);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var2) {
      operator_delete(local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (ulong)((long)&(local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,(string *)&local_160);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)&local_50);
  return;
}

Assistant:

void
QPDFJob::addAttachments(QPDF& pdf)
{
    maybe_set_pagemode(pdf, "/UseAttachments");
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    std::vector<std::string> duplicated_keys;
    for (auto const& to_add: m->attachments_to_add) {
        if ((!to_add.replace) && efdh.getEmbeddedFile(to_add.key)) {
            duplicated_keys.push_back(to_add.key);
            continue;
        }

        auto fs = QPDFFileSpecObjectHelper::createFileSpec(pdf, to_add.filename, to_add.path);
        if (!to_add.description.empty()) {
            fs.setDescription(to_add.description);
        }
        auto efs = QPDFEFStreamObjectHelper(fs.getEmbeddedFileStream());
        efs.setCreationDate(to_add.creationdate).setModDate(to_add.moddate);
        if (!to_add.mimetype.empty()) {
            efs.setSubtype(to_add.mimetype);
        }

        efdh.replaceEmbeddedFile(to_add.key, fs);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": attached " << to_add.path << " as " << to_add.filename << " with key "
              << to_add.key << "\n";
        });
    }

    if (!duplicated_keys.empty()) {
        std::string message;
        for (auto const& k: duplicated_keys) {
            if (!message.empty()) {
                message += ", ";
            }
            message += k;
        }
        message = pdf.getFilename() +
            " already has attachments with the following keys: " + message +
            "; use --replace to replace or --key to specify a different key";
        throw std::runtime_error(message);
    }
}